

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

x86Reg __thiscall CodeGenGenericContext::GetReg(CodeGenGenericContext *this)

{
  x86Reg res;
  CodeGenGenericContext *this_local;
  
  this_local._4_4_ = GetReg::regs[this->currFreeReg];
  if (this_local._4_4_ == rR11) {
    this->currFreeReg = 0;
  }
  else {
    this->currFreeReg = this->currFreeReg + 1;
  }
  if ((this_local._4_4_ == this->lockedRegA) || (this_local._4_4_ == this->lockedRegB)) {
    this_local._4_4_ = GetReg(this);
  }
  return this_local._4_4_;
}

Assistant:

x86Reg CodeGenGenericContext::GetReg()
{
#if defined(_M_X64)
	static x86Reg regs[] = { rRAX, rRDX, rEDI, rESI, rR8, rR9, rR10, rR11, rR12 };

	// Simple rotation
	x86Reg res = regs[currFreeReg];

	if(res == rR11)
		currFreeReg = 0;
	else
		currFreeReg += 1;
#else
	static x86Reg regs[] = { rEAX, rEDX, rEDI, rECX };

	// Simple rotation
	x86Reg res = regs[currFreeReg];

	if(res == rECX)
		currFreeReg = 0;
	else
		currFreeReg += 1;
#endif

	if(res == lockedRegA || res == lockedRegB)
		return GetReg();

	return res;
}